

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# atomic_guarded.hpp
# Opt level: O0

void __thiscall
gmlc::libguarded::
atomic_guarded<std::function<void(helics::Input&,TimeRepresentation<count_time<9,long>>)>,std::mutex>
::store<std::function<void(helics::Input&,TimeRepresentation<count_time<9,long>>)>>
          (atomic_guarded<std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>,_std::mutex>
           *this,function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *newObj)

{
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *in_RDI;
  function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)> *unaff_retaddr;
  lock_guard<std::mutex> glock;
  mutex_type *in_stack_ffffffffffffffd8;
  
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RDI,in_stack_ffffffffffffffd8);
  std::function<void_(helics::Input_&,_TimeRepresentation<count_time<9,_long>_>)>::operator=
            (unaff_retaddr,in_RDI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x2a0e0f);
  return;
}

Assistant:

void store(objType&& newObj)
    {  // uses a forwarding reference
        std::lock_guard<M> glock(m_mutex);
        m_obj = std::forward<objType>(newObj);
    }